

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O0

void cmd_release(command *cmd)

{
  int local_14;
  wchar_t i;
  command *cmd_local;
  
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    if (cmd->arg[local_14].type == arg_STRING) {
      string_free(cmd->arg[local_14].data.string);
      cmd->arg[local_14].name[0] = '\0';
      cmd->arg[local_14].type = arg_NONE;
    }
  }
  return;
}

Assistant:

void cmd_release(struct command *cmd)
{
	int i;

	for (i = 0; i < CMD_MAX_ARGS; ++i) {
		if (cmd->arg[i].type == arg_STRING) {
			string_free((char*)(cmd->arg[i].data.string));
			cmd->arg[i].name[0] = '\0';
			cmd->arg[i].type = arg_NONE;
		}
	}
}